

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

void __thiscall
mjs::interpreter::impl::auto_scope::auto_scope
          (auto_scope *this,impl *parent,object_ptr *act,scope_ptr *prev)

{
  gc_heap *this_00;
  
  this->parent = parent;
  this_00 = (parent->active_scope_).super_gc_heap_ptr_untyped.heap_;
  (this->old_scopes).super_gc_heap_ptr_untyped.heap_ = this_00;
  (this->old_scopes).super_gc_heap_ptr_untyped.pos_ =
       (parent->active_scope_).super_gc_heap_ptr_untyped.pos_;
  if (this_00 != (gc_heap *)0x0) {
    gc_heap::attach(this_00,&(this->old_scopes).super_gc_heap_ptr_untyped);
  }
  gc_heap::
  allocate_and_construct<mjs::interpreter::impl::scope,mjs::gc_heap_ptr<mjs::object>const&,mjs::gc_heap_ptr<mjs::interpreter::impl::scope>const&>
            ((gc_heap *)&stack0xffffffffffffffd0,(size_t)(act->super_gc_heap_ptr_untyped).heap_,
             (gc_heap_ptr<mjs::object> *)0x18,(gc_heap_ptr<mjs::interpreter::impl::scope> *)act);
  gc_heap_ptr_untyped::operator=
            (&(parent->active_scope_).super_gc_heap_ptr_untyped,
             (gc_heap_ptr_untyped *)&stack0xffffffffffffffd0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffd0);
  return;
}

Assistant:

explicit auto_scope(impl& parent, const object_ptr& act, const scope_ptr& prev) : parent(parent), old_scopes(parent.active_scope_) {
            parent.active_scope_ = act.heap().make<scope>(act, prev);
        }